

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O2

void __thiscall Comment_BashMultipleLeading_Test::TestBody(Comment_BashMultipleLeading_Test *this)

{
  TypedExpectation<std::error_code_()> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  extensions extensions;
  pointer *__ptr;
  mock_json_callbacks *in_RSI;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  AssertHelper local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  p.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )mock_json_callbacks::gmock_null_value
                   ((MockSpec<std::error_code_()> *)&(this->super_Comment).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  extensions = 0x16d83b;
  this_00 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                      ((MockSpec<std::error_code_()> *)&p,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                       ,0x34,"callbacks_","null_value ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(this_00,1);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            (&p,(json *)&(this->super_Comment).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x1,
             extensions);
  s_abi_cxx11_(&local_108,"# comment\n\n    # remark\nnull",0x1c);
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input(&p,&local_108);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  std::__cxx11::string::~string((string *)&local_108);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = p.error_._M_value == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_118);
    std::operator<<((ostream *)(local_118._M_head_impl + 0x10),"JSON error was: ");
    (**(code **)(*(long *)p.error_._M_cat + 0x20))(&local_108,p.error_._M_cat,p.error_._M_value);
    std::operator<<((ostream *)(local_118._M_head_impl + 0x10),(string *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&gtest_ar_,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x38,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (Comment, BashMultipleLeading) {
    EXPECT_CALL (callbacks_, null_value ()).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_, json::extensions::bash_comments);
    p.input ("# comment\n\n    # remark\nnull"s).eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
}